

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_converter.hpp
# Opt level: O0

double trial::protocol::json::detail::power10<double>(int exponent)

{
  __type_conflict _Stack_10;
  int exponent_local;
  
  switch(exponent) {
  case 0:
    _Stack_10 = 1.0;
    break;
  case 1:
    _Stack_10 = 10.0;
    break;
  case 2:
    _Stack_10 = 100.0;
    break;
  case 3:
    _Stack_10 = 1000.0;
    break;
  case 4:
    _Stack_10 = 10000.0;
    break;
  case 5:
    _Stack_10 = 100000.0;
    break;
  case 6:
    _Stack_10 = 1000000.0;
    break;
  case 7:
    _Stack_10 = 10000000.0;
    break;
  case 8:
    _Stack_10 = 100000000.0;
    break;
  case 9:
    _Stack_10 = 1000000000.0;
    break;
  case 10:
    _Stack_10 = 10000000000.0;
    break;
  default:
    _Stack_10 = std::pow<double,int>(10.0,exponent);
  }
  return _Stack_10;
}

Assistant:

RealT power10(int exponent)
{
    switch (exponent)
    {
    case 0: return RealT(1.0);
    case 1: return RealT(1E1);
    case 2: return RealT(1E2);
    case 3: return RealT(1E3);
    case 4: return RealT(1E4);
    case 5: return RealT(1E5);
    case 6: return RealT(1E6);
    case 7: return RealT(1E7);
    case 8: return RealT(1E8);
    case 9: return RealT(1E9);
    case 10: return RealT(1E10);
    default: return std::pow(RealT(10), exponent);
    }
}